

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::usmAllocPropertiesOverride
          (CLIntercept *this,cl_mem_properties_intel *properties,
          cl_mem_properties_intel **pLocalAllocProperties)

{
  bool bVar1;
  cl_mem_properties_intel cVar2;
  ulong uVar3;
  cl_mem_properties_intel *pcVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  
  bVar1 = (this->m_Config).RelaxAllocationLimits;
  uVar3 = 0;
  bVar7 = bVar1;
  if (properties == (cl_mem_properties_intel *)0x0) {
LAB_0016e118:
    uVar5 = uVar3 + 2;
    if ((bVar7 & 1) == 0) {
      uVar5 = uVar3;
    }
    lVar6 = 0;
    pcVar4 = (cl_mem_properties_intel *)
             operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3 | 8);
    *pLocalAllocProperties = pcVar4;
    if (properties != (cl_mem_properties_intel *)0x0) {
      for (lVar6 = 0; cVar2 = properties[lVar6], cVar2 != 0; lVar6 = lVar6 + 2) {
        pcVar4[lVar6] = cVar2;
        uVar3 = properties[lVar6 + 1];
        uVar5 = uVar3 | 0x800000;
        if ((bVar1 & 1U) == 0) {
          uVar5 = uVar3;
        }
        if (cVar2 != 0x1101) {
          uVar5 = uVar3;
        }
        pcVar4[lVar6 + 1] = uVar5;
      }
    }
    if ((bVar7 & 1) != 0) {
      pcVar4[lVar6] = 0x1101;
      pcVar4[lVar6 + 1] = (ulong)bVar1 << 0x17;
      lVar6 = lVar6 + 2;
    }
    pcVar4[lVar6] = 0;
    return;
  }
  do {
    if (properties[uVar3] == 0x1101) {
      bVar7 = 0;
    }
    else if (properties[uVar3] == 0) goto LAB_0016e118;
    uVar3 = uVar3 + 2;
  } while( true );
}

Assistant:

void CLIntercept::usmAllocPropertiesOverride(
    const cl_mem_properties_intel* properties,
    cl_mem_properties_intel*& pLocalAllocProperties ) const
{
    const cl_mem_flags CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL = (1 << 23);

    bool    addMemFlagsEnum = config().RelaxAllocationLimits != 0;

    size_t  numProperties = 0;
    if( properties )
    {
        while( properties[ numProperties ] != 0 )
        {
            switch( properties[ numProperties ] )
            {
            case CL_MEM_FLAGS:
                addMemFlagsEnum = false;
                break;
            default:
                break;
            }
            numProperties += 2;
        }
    }

    if( addMemFlagsEnum )
    {
        numProperties += 2;
    }

    // Allocate a new array of properties.  We need to allocate two
    // properties for each pair, plus one property for the terminating
    // zero.
    pLocalAllocProperties = new cl_queue_properties[ numProperties + 1 ];
    if( pLocalAllocProperties )
    {
        // Copy the old properties array to the new properties array,
        // if the new properties array exists.
        numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                pLocalAllocProperties[ numProperties ] = properties[ numProperties ];
                if( properties[ numProperties ] == CL_MEM_FLAGS )
                {
                    CLI_ASSERT( addMemFlagsEnum == false );

                    cl_mem_properties_intel flags = properties[ numProperties + 1 ];
                    if( config().RelaxAllocationLimits )
                    {
                        flags |= CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
                    }

                    pLocalAllocProperties[ numProperties + 1 ] = flags;
                }
                else
                {
                    pLocalAllocProperties[ numProperties + 1 ] =
                        properties[ numProperties + 1 ];
                }
                numProperties += 2;
            }
        }
        if( addMemFlagsEnum )
        {
            pLocalAllocProperties[ numProperties] = CL_MEM_FLAGS;

            cl_mem_properties_intel flags = 0;
            if( config().RelaxAllocationLimits )
            {
                flags |= CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
            }

            pLocalAllocProperties[ numProperties + 1 ] = flags;
            numProperties += 2;
        }

        // Add the terminating zero.
        pLocalAllocProperties[ numProperties ] = 0;
    }
}